

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Heap<int>::Heap(Heap<int> *this,initializer_list<int> list,function<bool_(int_&,_int_&)> *func)

{
  uint uVar1;
  int i;
  uint uVar2;
  allocator_type local_29;
  
  this->_size = (uint)list._M_len;
  std::vector<int,_std::allocator<int>_>::vector(&this->_data,list,&local_29);
  std::function<bool_(int_&,_int_&)>::function(&this->fun,func);
  for (uVar2 = 0; uVar1 = this->_size, uVar2 < uVar1; uVar2 = uVar2 + 1) {
    HeapifyDown(this,uVar2);
  }
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    HeapifyUp(this,uVar2);
    uVar1 = this->_size;
  }
  return;
}

Assistant:

Heap<T>::Heap(initializer_list<T> list, function<bool(T &, T &)> func):_size(list.size()),_data(list),fun(func) {
    for(int i=0;i<_size;++i) {
        HeapifyDown(i);

    }
    for(int index=0;index<_size;++index) {
        HeapifyUp(index);
    }

}